

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O3

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitArrayFill(InternalAnalyzer *this,ArrayFill *curr)

{
  EffectAnalyzer *pEVar1;
  char cVar2;
  
  cVar2 = ::wasm::Type::isRef();
  if (cVar2 != '\0') {
    ::wasm::Type::getHeapType();
    cVar2 = ::wasm::HeapType::isBottom();
    if (cVar2 != '\0') {
      this->parent->trap = true;
      return;
    }
  }
  pEVar1 = this->parent;
  pEVar1->writesArray = true;
  pEVar1->implicitTrap = true;
  return;
}

Assistant:

void visitArrayFill(ArrayFill* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.writesArray = true;
      // Traps when the destination is null or when out of bounds.
      parent.implicitTrap = true;
    }